

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeLatLongMap.cpp
# Opt level: O2

void makeLatLongMap(EnvmapImage *image1,Header *header,RgbaChannels channels,char *outFileName,
                   int tileWidth,int tileHeight,LevelMode levelMode,LevelRoundingMode roundingMode,
                   Compression compression,int mapWidth,float filterRadius,int numSamples,
                   bool verbose)

{
  EnvmapImage *pEVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  Compression *pCVar8;
  ostream *poVar9;
  Array2D<Imf_3_2::Rgba> *pAVar10;
  NoImplExc *this;
  EnvmapImage *image2_00;
  int iVar11;
  int tileX;
  int tileY;
  int level;
  Box2i dw;
  TiledRgbaOutputFile out;
  EnvmapImage image2;
  
  if (levelMode != RIPMAP_LEVELS) {
    puVar6 = (undefined8 *)Imf_3_2::Header::dataWindow();
    *puVar6 = 0;
    *(int *)(puVar6 + 1) = mapWidth + -1;
    *(int *)((long)puVar6 + 0xc) = mapWidth / 2 + -1;
    puVar6 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar7 = (undefined8 *)Imf_3_2::Header::displayWindow();
    *puVar7 = *puVar6;
    puVar7[1] = puVar6[1];
    pCVar8 = (Compression *)Imf_3_2::Header::compression();
    *pCVar8 = compression;
    image2._type = ENVMAP_LATLONG;
    Imf_3_2::addEnvmap(header,&image2._type);
    iVar2 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
              (&out,outFileName,header,channels,tileWidth,tileHeight,levelMode,roundingMode,iVar2);
    if (verbose) {
      poVar9 = std::operator<<((ostream *)&std::cout,"writing file ");
      poVar9 = std::operator<<(poVar9,outFileName);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    EnvmapImage::EnvmapImage(&image2);
    iVar2 = 0;
    pEVar1 = &image2;
    while( true ) {
      image2_00 = pEVar1;
      iVar3 = Imf_3_2::TiledRgbaOutputFile::numLevels();
      if (iVar3 <= iVar2) break;
      if (verbose) {
        poVar9 = std::operator<<((ostream *)&std::cout,"level ");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar2);
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      Imf_3_2::TiledRgbaOutputFile::dataWindowForLevel((int)&dw);
      resizeLatLong(image1,image2_00,&dw,filterRadius,numSamples);
      pAVar10 = EnvmapImage::pixels(image2_00);
      Imf_3_2::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pAVar10->_data,1);
      iVar3 = 0;
      while( true ) {
        iVar11 = (int)(Rgba *)&out;
        iVar4 = Imf_3_2::TiledRgbaOutputFile::numYTiles(iVar11);
        if (iVar4 <= iVar3) break;
        iVar4 = 0;
        while( true ) {
          iVar5 = Imf_3_2::TiledRgbaOutputFile::numXTiles(iVar11);
          if (iVar5 <= iVar4) break;
          Imf_3_2::TiledRgbaOutputFile::writeTile(iVar11,iVar4,iVar3);
          iVar4 = iVar4 + 1;
        }
        iVar3 = iVar3 + 1;
      }
      iVar2 = iVar2 + 1;
      pEVar1 = image1;
      image1 = image2_00;
    }
    if (verbose) {
      poVar9 = std::operator<<((ostream *)&std::cout,"done.");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&image2._pixels);
    Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
    return;
  }
  this = (NoImplExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::NoImplExc::NoImplExc(this,"Cannot generate ripmap latitude-longitude environments.");
  __cxa_throw(this,&Iex_3_2::NoImplExc::typeinfo,Iex_3_2::NoImplExc::~NoImplExc);
}

Assistant:

void
makeLatLongMap (
    EnvmapImage&      image1,
    Header&           header,
    RgbaChannels      channels,
    const char        outFileName[],
    int               tileWidth,
    int               tileHeight,
    LevelMode         levelMode,
    LevelRoundingMode roundingMode,
    Compression       compression,
    int               mapWidth,
    float             filterRadius,
    int               numSamples,
    bool              verbose)
{
    if (levelMode == RIPMAP_LEVELS)
    {
        throw IEX::NoImplExc ("Cannot generate ripmap "
                              "latitude-longitude environments.");
    }

    //
    // Open the file that will contain the latitude-longitude map,
    // and write the header.
    //

    int mapHeight = mapWidth / 2;

    header.dataWindow () =
        Box2i (V2i (0, 0), V2i (mapWidth - 1, mapHeight - 1));
    header.displayWindow () = header.dataWindow ();
    header.compression ()   = compression;

    addEnvmap (header, ENVMAP_LATLONG);

    TiledRgbaOutputFile out (
        outFileName,
        header,
        channels,
        tileWidth,
        tileHeight,
        levelMode,
        roundingMode);
    if (verbose) cout << "writing file " << outFileName << endl;

    //
    // Generate the pixels for the various levels of the latitude-longitude
    // map, and store them in the file.  The pixels for the highest-resolution
    // level are generated by resampling the original input image; for each of
    // the other levels, the pixels are generated by resampling the previous
    // level.
    //

    EnvmapImage  image2;
    EnvmapImage* iptr1 = &image1;
    EnvmapImage* iptr2 = &image2;

    for (int level = 0; level < out.numLevels (); ++level)
    {
        if (verbose) cout << "level " << level << endl;

        Box2i dw = out.dataWindowForLevel (level);
        resizeLatLong (*iptr1, *iptr2, dw, filterRadius, numSamples);

        out.setFrameBuffer (&(iptr2->pixels ()[0][0]), 1, dw.max.x + 1);

        for (int tileY = 0; tileY < out.numYTiles (level); ++tileY)
            for (int tileX = 0; tileX < out.numXTiles (level); ++tileX)
                out.writeTile (tileX, tileY, level);

        swap (iptr1, iptr2);
    }

    if (verbose) cout << "done." << endl;
}